

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool TdokuConstrain(bool pencilmark,char *puzzle)

{
  bool bVar1;
  char *in_stack_000006b0;
  bool in_stack_000006bf;
  GeneratorDpllTriadSimd *in_stack_000006c0;
  
  bVar1 = anon_unknown.dwarf_11362::GeneratorDpllTriadSimd::Constrain
                    (in_stack_000006c0,in_stack_000006bf,in_stack_000006b0);
  return bVar1;
}

Assistant:

bool TdokuConstrain(bool pencilmark, char *puzzle) {
    return generator.Constrain(pencilmark, puzzle);
}